

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_geometry.cpp
# Opt level: O1

bool __thiscall
ON_Geometry::GetTightBoundingBox
          (ON_Geometry *this,ON_BoundingBox *tight_bbox,bool bGrowBoxAsInt,ON_Xform *xform)

{
  bool bVar1;
  undefined7 in_register_00000011;
  ON_3dPointArray corners;
  ON_BoundingBox world_bbox;
  ON_SimpleArray<ON_3dPoint> local_70;
  ON_BoundingBox local_58;
  
  if ((int)CONCAT71(in_register_00000011,bGrowBoxAsInt) != 0) {
    bVar1 = ON_BoundingBox::IsValid(tight_bbox);
    bGrowBoxAsInt = bVar1 && bGrowBoxAsInt;
  }
  if (bGrowBoxAsInt == false) {
    ON_BoundingBox::Destroy(tight_bbox);
  }
  if ((xform != (ON_Xform *)0x0) && (bVar1 = ON_Xform::IsIdentity(xform,0.0), !bVar1)) {
    ON_3dPointArray::ON_3dPointArray((ON_3dPointArray *)&local_70,8);
    ON_BoundingBox::ON_BoundingBox(&local_58);
    bVar1 = GetBoundingBox(this,&local_58.m_min,&local_58.m_max,false);
    if (bVar1) {
      ON_BoundingBox::GetCorners(&local_58,(ON_3dPointArray *)&local_70);
      bVar1 = ON_3dPointArray::GetTightBoundingBox
                        ((ON_3dPointArray *)&local_70,tight_bbox,bGrowBoxAsInt,xform);
      bGrowBoxAsInt = (bool)(bGrowBoxAsInt | bVar1);
    }
    ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&local_70);
    return bGrowBoxAsInt;
  }
  bVar1 = GetBoundingBox(this,&tight_bbox->m_min,&tight_bbox->m_max,bGrowBoxAsInt);
  return (bool)(bGrowBoxAsInt | bVar1);
}

Assistant:

bool ON_Geometry::GetTightBoundingBox( 
	ON_BoundingBox& tight_bbox, 
  bool bGrowBoxAsInt,
	const ON_Xform* xform
  ) const
{
  //	This implementation should be overridden by classes derived
  //  from ON_Geometry
  bool bGrowBox = (0!= bGrowBoxAsInt);
  if ( bGrowBox && !tight_bbox.IsValid() )
  {
    bGrowBox = false;
  }
  if ( !bGrowBox )
  {
    tight_bbox.Destroy();
  }

  if ( xform && !xform->IsIdentity() )
  {
    ON_3dPointArray corners(8);
    ON_BoundingBox world_bbox;
    if ( GetBoundingBox(world_bbox,false) )
    {
      world_bbox.GetCorners(corners);
      if ( corners.GetTightBoundingBox(tight_bbox,bGrowBox,xform) )
        bGrowBox = true;
    }
  }
  else
  {
    if ( GetBoundingBox(tight_bbox,bGrowBox) )
      bGrowBox = true;
  }

  return bGrowBox;
}